

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::CheckBinder::BindCheckColumn
          (BindResult *__return_storage_ptr__,CheckBinder *this,ColumnRefExpression *colref)

{
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *this_00;
  ColumnList *pCVar1;
  _Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  *this_01;
  bool bVar2;
  vector<duckdb::DummyBinding,_true> *pvVar3;
  size_type __n;
  reference this_02;
  NotImplementedException *this_03;
  reference pvVar4;
  ColumnDefinition *this_04;
  ParsedExpression *pPVar5;
  LogicalType *args;
  storage_t *args_1;
  BinderException *this_05;
  BindResult *this_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_07;
  allocator local_81;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  string local_78;
  BindResult *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = __return_storage_ptr__;
  bVar2 = ColumnRefExpression::IsQualified(colref);
  if ((!bVar2) &&
     ((this->super_ExpressionBinder).lambda_bindings.ptr !=
      (vector<duckdb::DummyBinding,_true> *)0x0)) {
    this_00 = &(this->super_ExpressionBinder).lambda_bindings;
    pvVar3 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator->(this_00);
    __n = ((long)(pvVar3->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>)
                 .super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x108;
    while (__n = __n - 1, __n != 0xffffffffffffffff) {
      pvVar3 = optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::operator*(this_00);
      this_02 = vector<duckdb::DummyBinding,_true>::get<true>(pvVar3,__n);
      (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                (&local_78,colref);
      bVar2 = Binding::HasMatchingBinding(&this_02->super_Binding,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      if (bVar2) {
        this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_78,
                   "Lambda functions are currently not supported in CHECK constraints.",&local_81);
        NotImplementedException::NotImplementedException(this_03,&local_78);
        __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  this_06 = local_58;
  if ((ulong)((long)(colref->column_names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(colref->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    this_07 = &colref->column_names;
    pCVar1 = this->columns;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_07,0);
    bVar2 = ColumnList::ColumnExists(pCVar1,pvVar4);
    this_06 = local_58;
    if (!bVar2) {
      this_05 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_78,
                 "Table does not contain column %s referenced in check constraint!",&local_81);
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(this_07,0);
      ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar4);
      BinderException::BinderException<std::__cxx11::string>(this_05,&local_78,&local_50);
      __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar1 = this->columns;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(this_07,0);
    this_04 = ColumnList::GetColumn(pCVar1,pvVar4);
    bVar2 = ColumnDefinition::Generated(this_04);
    if (bVar2) {
      pPVar5 = ColumnDefinition::GeneratedExpression(this_04);
      (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_78,pPVar5);
      (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])(this_06,this,&local_78,0,0);
    }
    else {
      this_01 = (_Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                 *)this->bound_columns;
      local_78._M_dataplus._M_p = (pointer)ColumnDefinition::Physical(this_04);
      ::std::__detail::
      _Insert<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert(this_01,(value_type *)&local_78);
      args = ColumnDefinition::Type(this_04);
      args_1 = ColumnDefinition::StorageOid(this_04);
      make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_long_const&>
                ((duckdb *)&local_78,args,args_1);
      local_80._M_head_impl = (Expression *)local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)0x0;
      BindResult::BindResult
                (this_06,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_80);
      if (local_80._M_head_impl != (Expression *)0x0) {
        (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_80._M_head_impl = (Expression *)0x0;
    }
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  else {
    ExpressionBinder::BindQualifiedColumnName
              (local_58,&this->super_ExpressionBinder,colref,&this->table);
  }
  return this_06;
}

Assistant:

BindResult CheckBinder::BindCheckColumn(ColumnRefExpression &colref) {

	if (!colref.IsQualified()) {
		if (lambda_bindings) {
			for (idx_t i = lambda_bindings->size(); i > 0; i--) {
				if ((*lambda_bindings)[i - 1].HasMatchingBinding(colref.GetName())) {
					// FIXME: support lambdas in CHECK constraints
					// FIXME: like so: return (*lambda_bindings)[i - 1].Bind(colref, i, depth);
					// FIXME: and move this to LambdaRefExpression::FindMatchingBinding
					throw NotImplementedException("Lambda functions are currently not supported in CHECK constraints.");
				}
			}
		}
	}

	if (colref.column_names.size() > 1) {
		return BindQualifiedColumnName(colref, table);
	}
	if (!columns.ColumnExists(colref.column_names[0])) {
		throw BinderException("Table does not contain column %s referenced in check constraint!",
		                      colref.column_names[0]);
	}
	auto &col = columns.GetColumn(colref.column_names[0]);
	if (col.Generated()) {
		auto bound_expression = col.GeneratedExpression().Copy();
		return BindExpression(bound_expression, 0, false);
	}
	bound_columns.insert(col.Physical());
	D_ASSERT(col.StorageOid() != DConstants::INVALID_INDEX);
	return BindResult(make_uniq<BoundReferenceExpression>(col.Type(), col.StorageOid()));
}